

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall CEditor::DoToolbar(CEditor *this,CUIRect ToolBar)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int64 iVar4;
  CLayerQuads *this_00;
  CQuad *pCVar5;
  CLayer *pCVar6;
  byte bVar7;
  int i_4;
  long lVar8;
  CUIRect *pCVar9;
  int i;
  long lVar10;
  long in_FS_OFFSET;
  float fVar11;
  CPoint CVar12;
  CUIRect Button;
  CUIRect TB_Bottom;
  CUIRect TB_Top;
  CUIRect ToolBar_local;
  float Mapping [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ToolBar_local = ToolBar;
  CUIRect::HSplitTop(&ToolBar_local,ToolBar.h * 0.5,&TB_Top,&TB_Bottom);
  CUIRect::HSplitBottom(&TB_Top,2.5,&TB_Top,(CUIRect *)0x0);
  CUIRect::HSplitTop(&TB_Bottom,2.5,(CUIRect *)0x0,&TB_Bottom);
  iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x6f,0);
  if (((char)iVar2 != '\0') &&
     (((iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x160),
       (char)iVar2 != '\0' ||
       (iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(this->m_pInput,0x164),
       (char)iVar2 != '\0')) && (this->m_Dialog == 0)))) {
    iVar2 = (*(this->super_IEditor).super_IInterface._vptr_IInterface[4])(this);
    if ((char)iVar2 == '\0') {
      InvokeFileDialog(this,-1,0,"Load map","Load","maps","",CallbackOpenMap,this);
    }
    else if (this->m_PopupEventWasActivated == 0) {
      this->m_PopupEventType = 1;
      this->m_PopupEventActivated = 1;
    }
  }
  iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x73,0);
  if ((((char)iVar2 != '\0') &&
      ((iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(), (char)iVar2 != '\0' ||
       (iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(), (char)iVar2 != '\0'))))
     && (this->m_Dialog == 0)) {
    if ((this->m_aFileName[0] == '\0') || (this->m_ValidSaveFilename != true)) {
      InvokeFileDialog(this,0,0,"Save map","Save","maps","",CallbackSaveMap,this);
    }
    else if (this->m_PopupEventWasActivated == 0) {
      str_copy(this->m_aFileSaveName,this->m_aFileName,0x200);
      this->m_PopupEventType = 4;
      this->m_PopupEventActivated = 1;
    }
  }
  CUIRect::VSplitLeft(&TB_Top,30.0,&Button,&TB_Top);
  iVar2 = DoButton_Editor(this,&DoToolbar::s_HqButton,"HD",(uint)this->m_ShowDetail,&Button,0,
                          "[ctrl+h] Toggle High Detail");
  if ((iVar2 != 0) ||
     ((iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x68,0),
      (char)iVar2 != '\0' &&
      ((iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(), (char)iVar2 != '\0' ||
       (iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(), (char)iVar2 != '\0'))))
     )) {
    this->m_ShowDetail = (bool)(this->m_ShowDetail ^ 1);
  }
  CUIRect::VSplitLeft(&TB_Top,5.0,(CUIRect *)0x0,&TB_Top);
  CUIRect::VSplitLeft(&TB_Top,40.0,&Button,&TB_Top);
  iVar2 = DoButton_Editor(this,&DoToolbar::s_AnimateButton,"Anim",(uint)this->m_Animate,&Button,0,
                          "[ctrl+m] Toggle animation");
  if ((iVar2 != 0) ||
     ((iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x6d,0),
      (char)iVar2 != '\0' &&
      ((iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(), (char)iVar2 != '\0' ||
       (iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(), (char)iVar2 != '\0'))))
     )) {
    iVar4 = time_get();
    this->m_AnimateStart = iVar4;
    this->m_Animate = (bool)(this->m_Animate ^ 1);
  }
  CUIRect::VSplitLeft(&TB_Top,5.0,(CUIRect *)0x0,&TB_Top);
  CUIRect::VSplitLeft(&TB_Top,40.0,&Button,&TB_Top);
  iVar2 = DoButton_Editor(this,&DoToolbar::s_ProofButton,"Proof",(uint)this->m_ProofBorders,&Button,
                          0,
                          "[ctrl+p] Toggles proof borders. These borders represent what a player maximum can see."
                         );
  if ((iVar2 != 0) ||
     ((iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x70,0),
      (char)iVar2 != '\0' &&
      ((iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(), (char)iVar2 != '\0' ||
       (iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(), (char)iVar2 != '\0'))))
     )) {
    this->m_ProofBorders = (bool)(this->m_ProofBorders ^ 1);
  }
  CUIRect::VSplitLeft(&TB_Top,5.0,(CUIRect *)0x0,&TB_Top);
  CUIRect::VSplitLeft(&TB_Top,40.0,&Button,&TB_Top);
  iVar2 = DoButton_Editor(this,&DoToolbar::s_TileInfoButton,"Info",(uint)this->m_ShowTileInfo,
                          &Button,0,"[ctrl+i] Show tile information");
  if ((iVar2 != 0) ||
     ((iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x69,0),
      (char)iVar2 != '\0' &&
      ((iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(), (char)iVar2 != '\0' ||
       (iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[4])(), (char)iVar2 != '\0'))))
     )) {
    this->m_ShowTileInfo = (bool)(this->m_ShowTileInfo ^ 1);
    this->m_ShowEnvelopePreview = 0;
  }
  CUIRect::VSplitLeft(&TB_Top,15.0,(CUIRect *)0x0,&TB_Top);
  CUIRect::VSplitLeft(&TB_Top,30.0,&Button,&TB_Top);
  iVar2 = DoButton_Ex(this,&DoToolbar::s_ZoomOutButton,"ZO",0,&Button,0,"[NumPad-] Zoom out",5,10.0)
  ;
  if (iVar2 != 0) {
    this->m_ZoomLevel = this->m_ZoomLevel + 0x32;
  }
  CUIRect::VSplitLeft(&TB_Top,30.0,&Button,&TB_Top);
  iVar2 = DoButton_Ex(this,&DoToolbar::s_ZoomNormalButton,"1:1",0,&Button,0,
                      "[NumPad*] Zoom to normal and remove editor offset",0,10.0);
  if (iVar2 != 0) {
    this->m_EditorOffsetX = 0.0;
    this->m_EditorOffsetY = 0.0;
    this->m_ZoomLevel = 100;
  }
  CUIRect::VSplitLeft(&TB_Top,30.0,&Button,&TB_Top);
  iVar2 = DoButton_Ex(this,&DoToolbar::s_ZoomInButton,"ZI",0,&Button,0,"[NumPad+] Zoom in",10,10.0);
  if (iVar2 != 0) {
    this->m_ZoomLevel = this->m_ZoomLevel + -0x32;
  }
  CUIRect::VSplitLeft(&TB_Top,10.0,(CUIRect *)0x0,&TB_Top);
  CUIRect::VSplitLeft(&TB_Top,30.0,&Button,&TB_Top);
  iVar2 = DoButton_Ex(this,&DoToolbar::s_AnimFasterButton,"A+",0,&Button,0,
                      "Increase animation speed",5,10.0);
  if (iVar2 != 0) {
    this->m_AnimateSpeed = this->m_AnimateSpeed + 0.5;
  }
  CUIRect::VSplitLeft(&TB_Top,30.0,&Button,&TB_Top);
  iVar2 = DoButton_Ex(this,&DoToolbar::s_AnimNormalButton,"1",0,&Button,0,"Normal animation speed",0
                      ,10.0);
  if (iVar2 != 0) {
    this->m_AnimateSpeed = 1.0;
  }
  CUIRect::VSplitLeft(&TB_Top,30.0,&Button,&TB_Top);
  iVar2 = DoButton_Ex(this,&DoToolbar::s_AnimSlowerButton,"A-",0,&Button,0,
                      "Decrease animation speed",10,10.0);
  if ((iVar2 != 0) && (0.5 < this->m_AnimateSpeed)) {
    this->m_AnimateSpeed = this->m_AnimateSpeed + -0.5;
  }
  CUIRect::VSplitLeft(&TB_Top,10.0,&Button,&TB_Top);
  iVar2 = -(uint)((this->m_Brush).m_lLayers.num_elements == 0);
  CUIRect::VSplitLeft(&TB_Top,30.0,&Button,&TB_Top);
  iVar3 = DoButton_Ex(this,&DoToolbar::s_FlipXButton,"X/X",iVar2,&Button,0,
                      "[N] Flip brush horizontal",5,10.0);
  if (((iVar3 != 0) ||
      (iVar3 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x6e,0),
      (char)iVar3 != '\0')) && (0 < (this->m_Brush).m_lLayers.num_elements)) {
    lVar10 = 0;
    do {
      (*(this->m_Brush).m_lLayers.list[lVar10]->_vptr_CLayer[7])();
      lVar10 = lVar10 + 1;
    } while (lVar10 < (this->m_Brush).m_lLayers.num_elements);
  }
  CUIRect::VSplitLeft(&TB_Top,30.0,&Button,&TB_Top);
  iVar3 = DoButton_Ex(this,&DoToolbar::s_FlipyButton,"Y/Y",iVar2,&Button,0,"[M] Flip brush vertical"
                      ,10,10.0);
  if (((iVar3 != 0) ||
      (iVar3 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x6d,0),
      (char)iVar3 != '\0')) && (0 < (this->m_Brush).m_lLayers.num_elements)) {
    lVar10 = 0;
    do {
      (*(this->m_Brush).m_lLayers.list[lVar10]->_vptr_CLayer[8])();
      lVar10 = lVar10 + 1;
    } while (lVar10 < (this->m_Brush).m_lLayers.num_elements);
  }
  CUIRect::VSplitLeft(&TB_Top,15.0,&Button,&TB_Top);
  CUIRect::VSplitLeft(&TB_Top,30.0,&Button,&TB_Top);
  lVar10 = (long)(this->m_Brush).m_lLayers.num_elements;
  fVar11 = 10.0;
  if (0 < lVar10) {
    lVar8 = 0;
    do {
      if ((this->m_Brush).m_lLayers.list[lVar8]->m_Type == 2) {
        DoToolbar::s_RotationAmount = (DoToolbar::s_RotationAmount / 0x5a) * 0x5a;
        iVar3 = 0x5a;
        if (DoToolbar::s_RotationAmount < 0x5b) {
          DoToolbar::s_RotationAmount = 0x5a;
        }
        goto LAB_00194ee4;
      }
      lVar8 = lVar8 + 1;
    } while (lVar10 != lVar8);
  }
  iVar3 = 1;
  fVar11 = 2.0;
LAB_00194ee4:
  DoToolbar::s_RotationAmount =
       UiDoValueSelector(this,&DoToolbar::s_RotationAmount,&Button,"",DoToolbar::s_RotationAmount,
                         iVar3,0x167,iVar3,fVar11,
                         "Rotation of the brush in degrees. Use left mouse button to drag and change the value. Hold shift to be more precise."
                        );
  CUIRect::VSplitLeft(&TB_Top,5.0,&Button,&TB_Top);
  CUIRect::VSplitLeft(&TB_Top,30.0,&Button,&TB_Top);
  iVar3 = DoButton_Ex(this,&DoToolbar::s_CcwButton,"CCW",iVar2,&Button,0,
                      "[R] Rotates the brush counter clockwise",5,10.0);
  if (((iVar3 != 0) ||
      (iVar3 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x72,0),
      (char)iVar3 != '\0')) && (0 < (this->m_Brush).m_lLayers.num_elements)) {
    lVar10 = 0;
    do {
      fVar11 = ((float)-DoToolbar::s_RotationAmount / 360.0) * 3.1415927;
      (*(this->m_Brush).m_lLayers.list[lVar10]->_vptr_CLayer[9])((ulong)(uint)(fVar11 + fVar11));
      lVar10 = lVar10 + 1;
    } while (lVar10 < (this->m_Brush).m_lLayers.num_elements);
  }
  CUIRect::VSplitLeft(&TB_Top,30.0,&Button,&TB_Top);
  iVar2 = DoButton_Ex(this,&DoToolbar::s_CwButton,"CW",iVar2,&Button,0,
                      "[T] Rotates the brush clockwise",10,10.0);
  if (((iVar2 != 0) ||
      (iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0x74,0),
      (char)iVar2 != '\0')) && (0 < (this->m_Brush).m_lLayers.num_elements)) {
    lVar10 = 0;
    do {
      fVar11 = ((float)DoToolbar::s_RotationAmount / 360.0) * 3.1415927;
      (*(this->m_Brush).m_lLayers.list[lVar10]->_vptr_CLayer[9])((ulong)(uint)(fVar11 + fVar11));
      lVar10 = lVar10 + 1;
    } while (lVar10 < (this->m_Brush).m_lLayers.num_elements);
  }
  pCVar9 = &Button;
  CUIRect::VSplitLeft(&TB_Top,10.0,pCVar9,&TB_Top);
  CUIRect::VSplitLeft(&TB_Top,60.0,pCVar9,&TB_Top);
  this_00 = (CLayerQuads *)GetSelectedLayer(this,(int)pCVar9);
  if ((this_00 == (CLayerQuads *)0x0) || ((this_00->super_CLayer).m_Type != 3)) {
    this_00 = (CLayerQuads *)0x0;
  }
  iVar2 = DoButton_Editor(this,&DoToolbar::s_NewButton,"Add Quad",
                          -(uint)(this_00 == (CLayerQuads *)0x0),&Button,0,"Adds a new quad");
  if ((this_00 != (CLayerQuads *)0x0) && (iVar2 != 0)) {
    CLayerGroup::Mapping((this->m_Map).m_lGroups.list[(uint)this->m_SelectedGroup],Mapping);
    pCVar5 = CLayerQuads::NewQuad(this_00);
    lVar10 = 0;
    do {
      CVar12.x = pCVar5->m_aPoints[lVar10].x +
                 (int)((((float)Mapping._8_8_ - (float)Mapping._0_8_) * 0.5 + (float)Mapping._0_8_)
                      * 1024.0);
      CVar12.y = pCVar5->m_aPoints[lVar10].y +
                 (int)(((SUB84(Mapping._8_8_,4) - SUB84(Mapping._0_8_,4)) * 0.5 +
                       SUB84(Mapping._0_8_,4)) * 1024.0);
      pCVar5->m_aPoints[lVar10] = CVar12;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
  }
  pCVar9 = &Button;
  CUIRect::VSplitLeft(&TB_Bottom,40.0,pCVar9,&TB_Bottom);
  pCVar6 = GetSelectedLayer(this,(int)pCVar9);
  if ((pCVar6 == (CLayer *)0x0) || (bVar7 = 1, pCVar6->m_Type != 2)) {
    bVar7 = 0;
  }
  iVar2 = DoButton_Editor(this,&DoToolbar::s_BorderBut,"Border",-(uint)(bVar7 ^ 1),&Button,0,
                          "Adds border tiles");
  if (((bVar7 ^ 1) == 0) && (iVar2 != 0)) {
    DoMapBorder(this);
  }
  CUIRect::VSplitLeft(&TB_Bottom,5.0,(CUIRect *)0x0,&TB_Bottom);
  CUIRect::VSplitLeft(&TB_Bottom,50.0,&Button,&TB_Bottom);
  iVar2 = DoButton_Editor(this,&DoToolbar::s_RefocusButton,"Refocus",
                          -(uint)(this->m_WorldOffsetX == 0.0 || this->m_WorldOffsetY == 0.0),
                          &Button,0,"[HOME] Restore map focus");
  if ((iVar2 != 0) ||
     ((this->m_EditBoxActive == 0 &&
      (iVar2 = (*(this->m_pInput->super_IInterface)._vptr_IInterface[5])(this->m_pInput,0xca,0),
      (char)iVar2 != '\0')))) {
    this->m_WorldOffsetX = 0.0;
    this->m_WorldOffsetY = 0.0;
  }
  CUIRect::VSplitLeft(&TB_Bottom,5.0,(CUIRect *)0x0,&TB_Bottom);
  CUIRect::VSplitLeft(&TB_Bottom,50.0,&Button,&TB_Bottom);
  iVar2 = DoButton_Editor(this,&DoToolbar::s_GridButton,"Grid",(uint)this->m_GridActive,&Button,0,
                          "Toggle Grid");
  if (iVar2 != 0) {
    this->m_GridActive = (bool)(this->m_GridActive ^ 1);
  }
  CUIRect::VSplitLeft(&TB_Bottom,30.0,(CUIRect *)0x0,&TB_Bottom);
  CUIRect::VSplitLeft(&TB_Bottom,30.0,&Button,&TB_Bottom);
  iVar2 = DoButton_Ex(this,&DoToolbar::s_GridIncreaseButton,"G-",0,&Button,0,"Decrease grid",5,10.0)
  ;
  if ((iVar2 != 0) && (1 < this->m_GridFactor)) {
    this->m_GridFactor = this->m_GridFactor + -1;
  }
  CUIRect::VSplitLeft(&TB_Bottom,30.0,&Button,&TB_Bottom);
  iVar2 = DoButton_Ex(this,&DoToolbar::s_GridNormalButton,"1",0,&Button,0,"Normal grid",0,10.0);
  if (iVar2 != 0) {
    this->m_GridFactor = 1;
  }
  CUIRect::VSplitLeft(&TB_Bottom,30.0,&Button,&TB_Bottom);
  iVar2 = DoButton_Ex(this,&DoToolbar::s_GridDecreaseButton,"G+",0,&Button,0,"Increase grid",10,10.0
                     );
  if ((iVar2 != 0) && (this->m_GridFactor < 0xf)) {
    this->m_GridFactor = this->m_GridFactor + 1;
  }
  CUIRect::VSplitLeft(&TB_Bottom,10.0,(CUIRect *)0x0,&TB_Bottom);
  CUIRect::VSplitLeft(&TB_Bottom,50.0,&Button,&TB_Bottom);
  iVar2 = DoButton_Editor(this,&DoToolbar::s_ColorPickingButton,"Pipette",
                          (uint)(this->m_MouseEdMode == 1),&Button,0,"Pick color from view");
  if (iVar2 != 0) {
    this->m_MouseEdMode = (uint)(this->m_MouseEdMode != 1);
  }
  if (0.0 < (this->m_SelectedColor).field_3.w) {
    CUIRect::VSplitLeft(&TB_Bottom,4.0,(CUIRect *)0x0,&TB_Bottom);
    CUIRect::VSplitLeft(&TB_Bottom,24.0,&Button,&TB_Bottom);
    CUIRect::Draw(&Button,&this->m_SelectedColor,0.0,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::DoToolbar(CUIRect ToolBar)
{
	CUIRect TB_Top, TB_Bottom;
	CUIRect Button;

	ToolBar.HSplitTop(ToolBar.h/2.0f, &TB_Top, &TB_Bottom);

	TB_Top.HSplitBottom(2.5f, &TB_Top, 0);
	TB_Bottom.HSplitTop(2.5f, 0, &TB_Bottom);

	// ctrl+o to open
	if(Input()->KeyPress(KEY_O) && (Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL)) && m_Dialog == DIALOG_NONE)
	{
		if(HasUnsavedData())
		{
			if(!m_PopupEventWasActivated)
			{
				m_PopupEventType = POPEVENT_LOAD;
				m_PopupEventActivated = true;
			}
		}
		else
			InvokeFileDialog(IStorage::TYPE_ALL, FILETYPE_MAP, "Load map", "Load", "maps", "", CallbackOpenMap, this);
	}

	// ctrl+s to save
	if(Input()->KeyPress(KEY_S) && (Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL)) && m_Dialog == DIALOG_NONE)
	{
		if(m_aFileName[0] && m_ValidSaveFilename)
		{
			if(!m_PopupEventWasActivated)
			{
				str_copy(m_aFileSaveName, m_aFileName, sizeof(m_aFileSaveName));
				m_PopupEventType = POPEVENT_SAVE;
				m_PopupEventActivated = true;
			}
		}
		else
			InvokeFileDialog(IStorage::TYPE_SAVE, FILETYPE_MAP, "Save map", "Save", "maps", "", CallbackSaveMap, this);
	}

	// detail button
	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_HqButton = 0;
	if(DoButton_Editor(&s_HqButton, "HD", m_ShowDetail, &Button, 0, "[ctrl+h] Toggle High Detail") ||
		(Input()->KeyPress(KEY_H) && (Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))))
	{
		m_ShowDetail = !m_ShowDetail;
	}

	TB_Top.VSplitLeft(5.0f, 0, &TB_Top);

	// animation button
	TB_Top.VSplitLeft(40.0f, &Button, &TB_Top);
	static int s_AnimateButton = 0;
	if(DoButton_Editor(&s_AnimateButton, "Anim", m_Animate, &Button, 0, "[ctrl+m] Toggle animation") ||
		(Input()->KeyPress(KEY_M) && (Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))))
	{
		m_AnimateStart = time_get();
		m_Animate = !m_Animate;
	}

	TB_Top.VSplitLeft(5.0f, 0, &TB_Top);

	// proof button
	TB_Top.VSplitLeft(40.0f, &Button, &TB_Top);
	static int s_ProofButton = 0;
	if(DoButton_Editor(&s_ProofButton, "Proof", m_ProofBorders, &Button, 0, "[ctrl+p] Toggles proof borders. These borders represent what a player maximum can see.") ||
		(Input()->KeyPress(KEY_P) && (Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))))
	{
		m_ProofBorders = !m_ProofBorders;
	}

	TB_Top.VSplitLeft(5.0f, 0, &TB_Top);

	// tile info button
	TB_Top.VSplitLeft(40.0f, &Button, &TB_Top);
	static int s_TileInfoButton = 0;
	if(DoButton_Editor(&s_TileInfoButton, "Info", m_ShowTileInfo, &Button, 0, "[ctrl+i] Show tile information") ||
		(Input()->KeyPress(KEY_I) && (Input()->KeyIsPressed(KEY_LCTRL) || Input()->KeyIsPressed(KEY_RCTRL))))
	{
		m_ShowTileInfo = !m_ShowTileInfo;
		m_ShowEnvelopePreview = SHOWENV_NONE;
	}

	TB_Top.VSplitLeft(15.0f, 0, &TB_Top);

	// zoom group
	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_ZoomOutButton = 0;
	if(DoButton_Ex(&s_ZoomOutButton, "ZO", 0, &Button, 0, "[NumPad-] Zoom out", CUIRect::CORNER_L))
		m_ZoomLevel += 50;

	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_ZoomNormalButton = 0;
	if(DoButton_Ex(&s_ZoomNormalButton, "1:1", 0, &Button, 0, "[NumPad*] Zoom to normal and remove editor offset", 0))
	{
		m_EditorOffsetX = 0;
		m_EditorOffsetY = 0;
		m_ZoomLevel = 100;
	}

	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_ZoomInButton = 0;
	if(DoButton_Ex(&s_ZoomInButton, "ZI", 0, &Button, 0, "[NumPad+] Zoom in", CUIRect::CORNER_R))
		m_ZoomLevel -= 50;

	TB_Top.VSplitLeft(10.0f, 0, &TB_Top);

	// animation speed
	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_AnimFasterButton = 0;
	if(DoButton_Ex(&s_AnimFasterButton, "A+", 0, &Button, 0, "Increase animation speed", CUIRect::CORNER_L))
		m_AnimateSpeed += 0.5f;

	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_AnimNormalButton = 0;
	if(DoButton_Ex(&s_AnimNormalButton, "1", 0, &Button, 0, "Normal animation speed", 0))
		m_AnimateSpeed = 1.0f;

	TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
	static int s_AnimSlowerButton = 0;
	if(DoButton_Ex(&s_AnimSlowerButton, "A-", 0, &Button, 0, "Decrease animation speed", CUIRect::CORNER_R))
	{
		if(m_AnimateSpeed > 0.5f)
			m_AnimateSpeed -= 0.5f;
	}

	TB_Top.VSplitLeft(10.0f, &Button, &TB_Top);


	// brush manipulation
	{
		int Enabled = m_Brush.IsEmpty()?-1:0;

		// flip buttons
		TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
		static int s_FlipXButton = 0;
		if(DoButton_Ex(&s_FlipXButton, "X/X", Enabled, &Button, 0, "[N] Flip brush horizontal", CUIRect::CORNER_L) || Input()->KeyPress(KEY_N))
		{
			for(int i = 0; i < m_Brush.m_lLayers.size(); i++)
				m_Brush.m_lLayers[i]->BrushFlipX();
		}

		TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
		static int s_FlipyButton = 0;
		if(DoButton_Ex(&s_FlipyButton, "Y/Y", Enabled, &Button, 0, "[M] Flip brush vertical", CUIRect::CORNER_R) || Input()->KeyPress(KEY_M))
		{
			for(int i = 0; i < m_Brush.m_lLayers.size(); i++)
				m_Brush.m_lLayers[i]->BrushFlipY();
		}

		// rotate buttons
		TB_Top.VSplitLeft(15.0f, &Button, &TB_Top);

		TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
		static int s_RotationAmount = 90;
		bool TileLayer = false;
		// check for tile layers in brush selection
		for(int i = 0; i < m_Brush.m_lLayers.size(); i++)
			if(m_Brush.m_lLayers[i]->m_Type == LAYERTYPE_TILES)
			{
				TileLayer = true;
				s_RotationAmount = maximum(90, (s_RotationAmount/90)*90);
				break;
			}
		s_RotationAmount = UiDoValueSelector(&s_RotationAmount, &Button, "", s_RotationAmount, TileLayer?90:1, 359, TileLayer?90:1, TileLayer?10.0f:2.0f, "Rotation of the brush in degrees. Use left mouse button to drag and change the value. Hold shift to be more precise.");

		TB_Top.VSplitLeft(5.0f, &Button, &TB_Top);
		TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
		static int s_CcwButton = 0;
		if(DoButton_Ex(&s_CcwButton, "CCW", Enabled, &Button, 0, "[R] Rotates the brush counter clockwise", CUIRect::CORNER_L) || Input()->KeyPress(KEY_R))
		{
			for(int i = 0; i < m_Brush.m_lLayers.size(); i++)
				m_Brush.m_lLayers[i]->BrushRotate(-s_RotationAmount/360.0f*pi*2);
		}

		TB_Top.VSplitLeft(30.0f, &Button, &TB_Top);
		static int s_CwButton = 0;
		if(DoButton_Ex(&s_CwButton, "CW", Enabled, &Button, 0, "[T] Rotates the brush clockwise", CUIRect::CORNER_R) || Input()->KeyPress(KEY_T))
		{
			for(int i = 0; i < m_Brush.m_lLayers.size(); i++)
				m_Brush.m_lLayers[i]->BrushRotate(s_RotationAmount/360.0f*pi*2);
		}
	}

	// quad manipulation
	{
		// do add button
		TB_Top.VSplitLeft(10.0f, &Button, &TB_Top);
		TB_Top.VSplitLeft(60.0f, &Button, &TB_Top);
		static int s_NewButton = 0;

		CLayerQuads *pQLayer = (CLayerQuads *)GetSelectedLayerType(0, LAYERTYPE_QUADS);
		//CLayerTiles *tlayer = (CLayerTiles *)get_selected_layer_type(0, LAYERTYPE_TILES);
		if(DoButton_Editor(&s_NewButton, "Add Quad", pQLayer?0:-1, &Button, 0, "Adds a new quad"))
		{
			if(pQLayer)
			{
				float Mapping[4];
				CLayerGroup *g = GetSelectedGroup();
				g->Mapping(Mapping);
				int AddX = f2fx(Mapping[0] + (Mapping[2]-Mapping[0])/2);
				int AddY = f2fx(Mapping[1] + (Mapping[3]-Mapping[1])/2);

				CQuad *q = pQLayer->NewQuad();
				for(int i = 0; i < 5; i++)
				{
					q->m_aPoints[i].x += AddX;
					q->m_aPoints[i].y += AddY;
				}
			}
		}
	}

	// tile manipulation
	{
		TB_Bottom.VSplitLeft(40.0f, &Button, &TB_Bottom);
		static int s_BorderBut = 0;
		CLayerTiles *pT = (CLayerTiles *)GetSelectedLayerType(0, LAYERTYPE_TILES);

		if(DoButton_Editor(&s_BorderBut, "Border", pT?0:-1, &Button, 0, "Adds border tiles"))
		{
			if(pT)
				DoMapBorder();
		}
	}

	TB_Bottom.VSplitLeft(5.0f, 0, &TB_Bottom);

	// refocus button
	TB_Bottom.VSplitLeft(50.0f, &Button, &TB_Bottom);
	static int s_RefocusButton = 0;
	if(DoButton_Editor(&s_RefocusButton, "Refocus", m_WorldOffsetX&&m_WorldOffsetY?0:-1, &Button, 0, "[HOME] Restore map focus") || (m_EditBoxActive == 0 && Input()->KeyPress(KEY_HOME)))
	{
		m_WorldOffsetX = 0;
		m_WorldOffsetY = 0;
	}

	TB_Bottom.VSplitLeft(5.0f, 0, &TB_Bottom);

	// grid button
	TB_Bottom.VSplitLeft(50.0f, &Button, &TB_Bottom);
	static int s_GridButton = 0;
	if(DoButton_Editor(&s_GridButton, "Grid", m_GridActive, &Button, 0, "Toggle Grid"))
	{
		m_GridActive = !m_GridActive;
	}

	TB_Bottom.VSplitLeft(30.0f, 0, &TB_Bottom);

	// grid zoom
	TB_Bottom.VSplitLeft(30.0f, &Button, &TB_Bottom);
	static int s_GridIncreaseButton = 0;
	if(DoButton_Ex(&s_GridIncreaseButton, "G-", 0, &Button, 0, "Decrease grid", CUIRect::CORNER_L))
	{
		if(m_GridFactor > 1)
			m_GridFactor--;
	}

	TB_Bottom.VSplitLeft(30.0f, &Button, &TB_Bottom);
	static int s_GridNormalButton = 0;
	if(DoButton_Ex(&s_GridNormalButton, "1", 0, &Button, 0, "Normal grid", 0))
		m_GridFactor = 1;

	TB_Bottom.VSplitLeft(30.0f, &Button, &TB_Bottom);

	static int s_GridDecreaseButton = 0;
	if(DoButton_Ex(&s_GridDecreaseButton, "G+", 0, &Button, 0, "Increase grid", CUIRect::CORNER_R))
	{
		if(m_GridFactor < 15)
			m_GridFactor++;
	}

	TB_Bottom.VSplitLeft(10.0f, 0, &TB_Bottom);

	// pipette / color picking
	TB_Bottom.VSplitLeft(50.0f, &Button, &TB_Bottom);
	static int s_ColorPickingButton = 0;
	if(DoButton_Editor(&s_ColorPickingButton, "Pipette", m_MouseEdMode == MOUSE_PIPETTE, &Button, 0, "Pick color from view"))
	{
		// toggle mouse mode
		if(m_MouseEdMode == MOUSE_PIPETTE)
			m_MouseEdMode = MOUSE_EDIT;
		else
			m_MouseEdMode = MOUSE_PIPETTE;
	}

	// display selected color
	if(m_SelectedColor.a > 0.0f)
	{
		TB_Bottom.VSplitLeft(4.0f, 0, &TB_Bottom);

		TB_Bottom.VSplitLeft(24.0f, &Button, &TB_Bottom);
		Button.Draw(m_SelectedColor, 0.0f, CUIRect::CORNER_NONE);
	}

}